

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadSplat<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  Instr instr_00;
  RunResult RVar1;
  unsigned_long *__first;
  unsigned_long *__last;
  unsigned_long local_50;
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  unsigned_long local_28;
  L val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  instr_00 = instr;
  result.v[1]._0_4_ = instr.op.enum_;
  result.v[1]._4_4_ = instr.kind;
  val = (L)out_trap;
  out_trap_local = (Ptr *)this;
  RVar1 = Load<unsigned_long>(this,instr_00,&local_28,out_trap);
  if (RVar1 == Ok) {
    __first = std::begin<unsigned_long,2ul>((unsigned_long (*) [2])&local_50);
    __last = std::end<unsigned_long,2ul>((unsigned_long (*) [2])&local_50);
    std::fill<unsigned_long*,unsigned_long>(__first,__last,&local_28);
    value.v[1] = result.v[0];
    value.v[0] = local_50;
    Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}